

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double __thiscall
ON_SubDEdge::GetSharpSubdivisionPoint(ON_SubDEdge *this,ON_3dPoint *sharp_subdivision_point)

{
  bool bVar1;
  ON_3dPoint local_48;
  ON_SubDEdgeSharpness local_30;
  ON_SubDEdge *local_28;
  double s;
  ON_3dPoint *sharp_subdivision_point_local;
  ON_SubDEdge *this_local;
  
  s = (double)sharp_subdivision_point;
  sharp_subdivision_point_local = (ON_3dPoint *)this;
  bVar1 = IsSharp(this);
  if (bVar1) {
    local_30 = Sharpness(this,false);
    local_28 = (ON_SubDEdge *)ON_SubDEdgeSharpness::Average(&local_30);
    ControlNetCenterPoint(&local_48,this);
    *(double *)s = local_48.x;
    *(double *)((long)s + 8) = local_48.y;
    *(double *)((long)s + 0x10) = local_48.z;
    this_local = local_28;
  }
  else {
    *(double *)s = ON_3dPoint::NanPoint.x;
    *(double *)((long)s + 8) = ON_3dPoint::NanPoint.y;
    *(double *)((long)s + 0x10) = ON_3dPoint::NanPoint.z;
    this_local = (ON_SubDEdge *)0x0;
  }
  return (double)this_local;
}

Assistant:

double ON_SubDEdge::GetSharpSubdivisionPoint(ON_3dPoint& sharp_subdivision_point) const
{
  if (IsSharp())
  {
    const double s = Sharpness(false).Average();
    sharp_subdivision_point = this->ControlNetCenterPoint();
    return s;
  }

  sharp_subdivision_point = ON_3dPoint::NanPoint;
  return 0.0;
}